

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select_iterrupter.cpp
# Opt level: O1

void booster::aio::impl::anon_unknown_1::check(native_type t)

{
  int iVar1;
  int *piVar2;
  system_error *this;
  
  if (t != -1) {
    return;
  }
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  this = (system_error *)__cxa_allocate_exception(0x40);
  system::system_error::system_error(this,iVar1,syscat);
  __cxa_throw(this,&system::system_error::typeinfo,system::system_error::~system_error);
}

Assistant:

void check(native_type t)
		{
			if(t==invalid_socket) {
				#ifdef BOOSTER_WIN32
				int ec = WSAGetLastError();
				#else
				int ec=errno;
				#endif
				throw system::system_error(ec,syscat);
			}
		}